

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

string * __thiscall
kratos::port_dir_to_str_abi_cxx11_
          (string *__return_storage_ptr__,kratos *this,PortDirection direction)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((int)this == 1) {
    pcVar2 = "output";
    pcVar1 = "";
  }
  else if ((int)this == 0) {
    pcVar2 = "input";
    pcVar1 = "";
  }
  else {
    pcVar2 = "inout";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string port_dir_to_str(PortDirection direction) {
    if (direction == PortDirection::In) {
        return "input";
    } else if (direction == PortDirection::Out) {
        return "output";
    } else {
        return "inout";
    }
}